

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86emithelper.cpp
# Opt level: O3

Error asmjit::_abi_1_10::x86::Emitter_emitArgsAssignment
                (BaseEmitter *emitter,FuncFrame *frame,FuncArgsAssignment *args)

{
  Error EVar1;
  EmitHelper emitHelper;
  BaseEmitHelper local_18;
  undefined1 local_8;
  byte local_7;
  
  local_7 = (byte)(frame->_attributes >> 0x11) & 1;
  local_18._vptr_BaseEmitHelper = (_func_int **)&PTR_emitRegMove_00170bd0;
  local_8 = (frame->_attributes & (kX86_AVX512Enabled|kX86_AVXEnabled)) != kNoAttributes;
  local_18._emitter = emitter;
  EVar1 = BaseEmitHelper::emitArgsAssignment(&local_18,frame,args);
  return EVar1;
}

Assistant:

static Error ASMJIT_CDECL Emitter_emitArgsAssignment(BaseEmitter* emitter, const FuncFrame& frame, const FuncArgsAssignment& args) {
  EmitHelper emitHelper(emitter, frame.isAvxEnabled(), frame.isAvx512Enabled());
  return emitHelper.emitArgsAssignment(frame, args);
}